

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O2

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::
Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
::init<Kernel::TypedTermList>
          (Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
           *this,SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs> *parent,Node *root,
          TypedTermList query,bool retrieveSubstitution,bool reversed)

{
  BacktrackData ***pppBVar1;
  OptionBase<Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>_> local_48;
  
  Kernel::RobSubstitution::reset((RobSubstitution *)this);
  this->_retrieveSubstitution = retrieveSubstitution;
  local_48._isSome = false;
  local_48._1_7_ = 0;
  local_48._elem._elem = (Value)0x0;
  Lib::OptionBase<Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>_>::operator=
            (&(this->_leafData).
              super_OptionBase<Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>_>,
             &local_48);
  Lib::OptionBase<Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>_>::~OptionBase
            (&local_48);
  this->_normalizationRecording = false;
  if (root != (Node *)0x0) {
    Lib::Stack<Lib::BacktrackData_*>::push
              ((Stack<Lib::BacktrackData_*> *)this,&this->_queryInitBacktrackData);
    createBindings<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0u>>>::init<Kernel::TypedTermList>(Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>*,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node*,Kernel::TypedTermList,bool,bool)::_lambda(unsigned_int,Kernel::TermList)_1_>
              (parent,query,reversed,(anon_class_8_1_8991fb9c)this);
    pppBVar1 = &(this->_algo)._subs.super_Backtrackable._bdStack._cursor;
    *pppBVar1 = *pppBVar1 + -1;
    prepareChildren(this,root,false);
  }
  return;
}

Assistant:

void init(SubstitutionTree* parent, Node* root, TermOrLit query, bool retrieveSubstitution, bool reversed, AlgoArgs... args) {
        _algo.init(std::move(args)...);
        _retrieveSubstitution = retrieveSubstitution;
        _leafData = {};
        _normalizationRecording = false;
        _iterCntr = InstanceCntr(parent->_iterCnt);

#define DEBUG_QUERY(lvl, ...) if (lvl < 0) DBG(__VA_ARGS__)
        if(!root) {
          return;
        }

        _algo.bdRecord(_queryInitBacktrackData);
        parent->createBindings(query, reversed, 
            [&](unsigned var, TermList t) { _algo.bindQuerySpecialVar(var, t); });
        DEBUG_QUERY(1, "query: ", _algo)
        _algo.bdDone();


        prepareChildren(root, /* backtrackable */ false);
      }